

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

int dynamic_valid(menu_conflict *m,int oid)

{
  void *pvVar1;
  
  pvVar1 = m->menu_data;
  if (oid != 0) {
    do {
      pvVar1 = *(void **)((long)pvVar1 + 0x10);
      if (pvVar1 == (void *)0x0) {
        __assert_fail("entry",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                      ,0x3f9,"int dynamic_valid(struct menu *, int)");
      }
      oid = oid + -1;
    } while (oid != 0);
  }
  return *(int *)((long)pvVar1 + 0xc);
}

Assistant:

static int dynamic_valid(struct menu *m, int oid)
{
	struct menu_entry *entry;

	for (entry = menu_priv(m); oid; oid--) {
		entry = entry->next;
		assert(entry);
	}

	return entry->valid;
}